

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

GridHandle<pbrt::NanoVDBBuffer> *
nanovdb::io::readGrid<pbrt::NanoVDBBuffer>(istream *is,string *gridName,NanoVDBBuffer *buffer)

{
  undefined1 uVar1;
  bool bVar2;
  __type_conflict _Var3;
  uint64_t uVar4;
  ulong uVar5;
  reference pGVar6;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  long in_RSI;
  GridHandle<pbrt::NanoVDBBuffer> *in_RDI;
  GridMetaData *m;
  iterator __end3;
  iterator __begin3;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *__range3;
  streamoff seek;
  Segment s;
  uint64_t key;
  GridHandle<pbrt::NanoVDBBuffer> *handle;
  undefined7 in_stack_ffffffffffffff38;
  GridHandle<pbrt::NanoVDBBuffer> *pGVar7;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  __normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
  local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 auStack_40 [6];
  Codec in_stack_ffffffffffffffc6;
  pointer in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  
  pGVar7 = in_RDI;
  uVar4 = stringHash((string *)0x92a411);
  Segment::Segment((Segment *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (Codec)((ulong)pGVar7 >> 0x30));
  __buf = extraout_RDX;
  do {
    uVar5 = Segment::read((Segment *)&stack0xffffffffffffffb0,(int)in_RSI,__buf,in_RCX);
    uVar1 = (undefined1)uVar5;
    if ((uVar5 & 1) == 0) {
      memset(in_RDI,0,0x20);
      GridHandle<pbrt::NanoVDBBuffer>::GridHandle(in_RDI);
LAB_0092a624:
      Segment::~Segment((Segment *)0x92a62e);
      return pGVar7;
    }
    local_68 = 0;
    local_70 = auStack_40;
    local_78._M_current =
         (GridMetaData *)
         std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>::begin
                   ((vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *
                    )CONCAT17(uVar1,in_stack_ffffffffffffff38));
    std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>::end
              ((vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff38));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
                               *)in_RDI,
                              (__normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
                               *)CONCAT17(uVar1,in_stack_ffffffffffffff38)), bVar2) {
      pGVar6 = __gnu_cxx::
               __normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
               ::operator*(&local_78);
      if (((pGVar6->super_MetaData).nameKey == uVar4) &&
         (_Var3 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58), _Var3)) {
        pbrt::NanoVDBBuffer::create
                  ((uint64_t)in_stack_ffffffffffffff58,
                   (NanoVDBBuffer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        GridHandle<pbrt::NanoVDBBuffer>::GridHandle
                  (in_RDI,(NanoVDBBuffer *)CONCAT17(uVar1,in_stack_ffffffffffffff38));
        pbrt::NanoVDBBuffer::~NanoVDBBuffer((NanoVDBBuffer *)0x92a51b);
        std::istream::seekg(in_RSI,(_Ios_Seekdir)local_68);
        Internal::read<pbrt::NanoVDBBuffer>
                  ((istream *)in_stack_ffffffffffffffd0,
                   (GridHandle<pbrt::NanoVDBBuffer> *)in_stack_ffffffffffffffc8,
                   in_stack_ffffffffffffffc6);
        goto LAB_0092a624;
      }
      local_68 = (pGVar6->super_MetaData).fileSize + local_68;
      __gnu_cxx::
      __normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
      ::operator++(&local_78);
    }
    std::istream::seekg(in_RSI,(_Ios_Seekdir)local_68);
    __buf = extraout_RDX_00;
  } while( true );
}

Assistant:

GridHandle<BufferT> readGrid(std::istream& is, const std::string& gridName, const BufferT& buffer)
{
    const auto key = stringHash(gridName);
    Segment    s;
    while (s.read(is)) {
        std::streamoff seek = 0;
        for (auto& m : s.meta) {
            if (m.nameKey == key && m.gridName == gridName) { // check for hask key collision
                GridHandle<BufferT> handle(BufferT::create(m.gridSize, &buffer));
                is.seekg(seek, std::ios_base::cur); // rewind
                Internal::read(is, handle, s.header.codec);
                return handle; // is converted to r-value and return value is move constructed.
            } else {
                seek += m.fileSize;
            }
        }
        is.seekg(seek, std::ios_base::cur); // skip forward from the current position
    }
    return GridHandle<BufferT>(); // empty handle
}